

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall CTPNCall::gen_code_rand(CTPNCall *this,int discard,int for_condition)

{
  uint val_00;
  int iVar1;
  CTPNArglist *pCVar2;
  CTPNArg *pCVar3;
  CTcPrsNode *pCVar4;
  CTcGenTarg *pCVar5;
  CTcCodeLabel *lbl;
  size_t __n;
  CTPNArg **ppCVar6;
  CTPNArg **ppCVar7;
  uint uVar8;
  ulong intval;
  int iVar9;
  ulong ofs;
  char buf [5];
  vm_val_t val;
  CTcNamedArgs named_args;
  
  pCVar2 = (this->super_CTPNCallBase).arglist_;
  val_00 = (pCVar2->super_CTPNArglistBase).argc_;
  intval = (ulong)(int)val_00;
  if (1 < (long)intval) {
    ppCVar7 = &(pCVar2->super_CTPNArglistBase).list_;
    ppCVar6 = ppCVar7;
    do {
      pCVar3 = *ppCVar6;
      if (pCVar3 == (CTPNArg *)0x0) {
        named_args.cnt = 0;
        CTPNConst::s_gen_code_int(intval);
        pCVar4 = (this->super_CTPNCallBase).func_;
        __n = 0;
        (*(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x15])(pCVar4,0,1,0,&named_args);
        CTcGenTarg::write_op(G_cg,0x90);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,val_00);
        G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
        ofs = (G_cs->super_CTcDataStream).ofs_;
        while (0 < (int)intval) {
          uVar8 = (int)intval - 1;
          val.typ = VM_INT;
          val.val.obj = uVar8;
          vmb_put_dh(buf,&val);
          CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x5,__n);
          CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
          intval = (ulong)uVar8;
        }
        CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
        lbl = CTcCodeStream::new_label_fwd(G_cs);
        iVar9 = -5 - (int)ofs;
        while (pCVar3 = *ppCVar7, pCVar3 != (CTPNArg *)0x0) {
          CTcDataStream::write2_at
                    (&G_cs->super_CTcDataStream,ofs + 5,
                     (int)(G_cs->super_CTcDataStream).ofs_ + iVar9);
          pCVar4 = (pCVar3->super_CTPNArgBase).arg_expr_;
          (**(pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
                    (pCVar4,discard,(ulong)(uint)for_condition);
          CTcGenTarg::write_op(G_cg,0x91);
          CTcCodeStream::write_ofs2(G_cs,lbl,0);
          if (discard == 0) {
            G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
          }
          ofs = ofs + 7;
          iVar9 = iVar9 + -7;
          ppCVar7 = &(pCVar3->super_CTPNArgBase).next_arg_;
        }
        CTcDataStream::write2_at
                  (&G_cs->super_CTcDataStream,ofs,(int)(G_cs->super_CTcDataStream).ofs_ - (int)ofs);
        if (discard == 0) {
          CTcGenTarg::write_op(G_cg,'\b');
          pCVar5 = G_cg;
          iVar1 = G_cg->sp_depth_;
          iVar9 = iVar1 + 1;
          G_cg->sp_depth_ = iVar9;
          if (pCVar5->max_sp_depth_ <= iVar1) {
            pCVar5->max_sp_depth_ = iVar9;
          }
        }
        CTcPrsNode::def_label_pos(lbl);
        return 1;
      }
      ppCVar6 = &(pCVar3->super_CTPNArgBase).next_arg_;
    } while (((pCVar3->super_CTPNArgBase).field_0x40 & 1) == 0);
  }
  return 0;
}

Assistant:

int CTPNCall::gen_code_rand(int discard, int for_condition)
{
    /* get our argument list, and the number of arguments */
    CTPNArglist *args = get_arg_list();
    int argc = args->get_argc();

    /* if we have zero or one argument, use the normal call */
    if (argc < 2)
        return FALSE;

    /* if we have variable arguments, use the normal call */
    CTPNArg *arg;
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg())
    {
        if (arg->is_varargs())
            return FALSE;
    }

    /* 
     *   We have a fixed number of arguments greater than one, so this is the
     *   special form of the rand() call.  First, generate an ordinary call
     *   to rand() to select a number from 0 to argc-1.
     */
    CTcNamedArgs named_args;
    named_args.cnt = 0;
    CTPNConst::s_gen_code_int(argc);
    get_func()->gen_code_call(FALSE, 1, FALSE, &named_args);

    /* generate the SWITCH <case_cnt> */
    G_cg->write_op(OPC_SWITCH);
    G_cs->write2(argc);
    G_cg->note_pop();

    /* 
     *   Build the case table.  The rand() call gave us an integer from 0 to
     *   argc-1 inclusive, so our case labels are simply the argument index
     *   values, starting at zero.  Note that the argument list is stored
     *   right to left, so the index values of the list elements run from
     *   argc-1 down to 0.  Since we're making a random selection anyway the
     *   order shouldn't really matter; however, for the sake of regression
     *   tests for pre-3.1 games, we want to use the same index ordering that
     *   rand() did in the old version, where rand() itself chose one of its
     *   pre-evaluated arguments.  When running in regression mode with a
     *   fixed random number stream, using the same index ordering will
     *   ensure that we get the same results when running existing tests.  
     */
    ulong caseofs = G_cs->get_ofs();
    int i;
    for (i = argc - 1 ; i >= 0 ; --i)
    {
        /* write the case label as the 0-based argument index */
        char buf[VMB_DATAHOLDER];
        vm_val_t val;
        val.set_int(i);
        vmb_put_dh(buf, &val);
        G_cs->write(buf, VMB_DATAHOLDER);

        /* write a placeholder for the jump offset */
        G_cs->write2(0);
    }

    /* write a placeholder for the default case */
    G_cs->write2(0);

    /* create a forward label for the 'break' to the end of the switch */
    CTcCodeLabel *brklbl = G_cs->new_label_fwd();

    /* generate the argument expressions */
    for (arg = args->get_arg_list_head() ; arg != 0 ;
         arg = arg->get_next_arg(), caseofs += VMB_DATAHOLDER + 2)
    {
        /* set the jump to this case in the case table */
        G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                        G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

        /* generate the argument expression */
        arg->get_arg_expr()->gen_code(discard, for_condition);

        /* generate a jump to the end of the table */
        G_cg->write_op(OPC_JMP);
        G_cs->write_ofs2(brklbl, 0);

        /* we generate the branches in parallel, so only one push counts */
        if (!discard)
            G_cg->note_pop();
    }

    /* write the default case - just push nil if we need a value */
    G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->note_push();
    }

    /* this is the end of the switch - set the 'break' label here */
    def_label_pos(brklbl);

    /* tell the caller that we handled the code generation */
    return TRUE;
}